

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

void __thiscall PDA::Transducer::StoreFst::expandCurrentNTerminal(StoreFst *this)

{
  pointer *ppwVar1;
  int iVar2;
  pointer pRVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __tmp;
  value_type *__x;
  wstring currentChain;
  value_type *local_40;
  long local_38;
  
  ppwVar1 = &(this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  lVar6 = (long)(this->m_currentState).m_chainIndex + 1;
  iVar5 = (int)lVar6;
  (this->m_currentState).m_chainIndex = iVar5;
  iVar2 = (this->m_currentState).m_ruleIndex;
  pRVar3 = (this->m_grammar).m_rules.
           super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pRVar3[iVar2].m_chains.
                    super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
  ;
  if (iVar5 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pRVar3[iVar2].m_chains.
                                           super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                   + 8) - lVar4) >> 5)) {
    std::__cxx11::wstring::wstring((wstring *)&local_40,(wstring *)(lVar4 + lVar6 * 0x20));
    __x = local_40 + local_38;
    while (__x != local_40) {
      __x = __x + -1;
      std::vector<wchar_t,_std::allocator<wchar_t>_>::push_back(&(this->m_currentState).m_stack,__x)
      ;
    }
    (this->m_currentState).m_ruleIndex = -1;
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
    return;
  }
  rollback(this);
  return;
}

Assistant:

void expandCurrentNTerminal()
    {
        m_currentState.m_stack.pop_back();
        ++m_currentState.m_chainIndex;
        if ( m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()))
        {
            rollback();
            return;
        }
        std::wstring currentChain = m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex)].m_chain;
        for(auto it = currentChain.crbegin(); it != currentChain.crend(); ++it)
            m_currentState.m_stack.push_back(*it);
        m_currentState.m_ruleIndex = -1;
    }